

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall llbuild::buildsystem::BuildSystem::~BuildSystem(BuildSystem *this)

{
  void *pvVar1;
  
  pvVar1 = this->impl;
  if (pvVar1 != (void *)0x0) {
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
                  *)((long)pvVar1 + 0x118));
    llbuild::core::BuildEngine::~BuildEngine((BuildEngine *)((long)pvVar1 + 0x108));
    *(undefined ***)((long)pvVar1 + 0x70) = &PTR__BuildSystemEngineDelegate_0020bbd8;
    std::
    vector<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_std::allocator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
    ::~vector((vector<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_std::allocator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
               *)((long)pvVar1 + 0xf0));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)((long)pvVar1 + 0xb8));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)((long)pvVar1 + 0x80));
    llbuild::core::BuildEngineDelegate::~BuildEngineDelegate
              ((BuildEngineDelegate *)((long)pvVar1 + 0x70));
    if (*(BuildDescription **)((long)pvVar1 + 0x68) != (BuildDescription *)0x0) {
      std::default_delete<llbuild::buildsystem::BuildDescription>::operator()
                ((default_delete<llbuild::buildsystem::BuildDescription> *)((long)pvVar1 + 0x68),
                 *(BuildDescription **)((long)pvVar1 + 0x68));
    }
    *(undefined8 *)((long)pvVar1 + 0x68) = 0;
    *(undefined ***)((long)pvVar1 + 0x38) = &PTR__BuildSystemFileDelegate_0020b048;
    llvm::StringMap<bool,_llvm::MallocAllocator>::~StringMap
              ((StringMap<bool,_llvm::MallocAllocator> *)((long)pvVar1 + 0x48));
    BuildFileDelegate::~BuildFileDelegate((BuildFileDelegate *)((long)pvVar1 + 0x38));
    if (*(long **)((long)pvVar1 + 0x18) != (long *)((long)pvVar1 + 0x28)) {
      operator_delete(*(long **)((long)pvVar1 + 0x18),*(long *)((long)pvVar1 + 0x28) + 1);
    }
    if (*(long **)((long)pvVar1 + 0x10) != (long *)0x0) {
      (**(code **)(**(long **)((long)pvVar1 + 0x10) + 8))();
    }
  }
  operator_delete(pvVar1,0x138);
  return;
}

Assistant:

BuildSystem::~BuildSystem() {
  delete static_cast<BuildSystemImpl*>(impl);
}